

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall VmaBlockMetadata_TLSF::RemoveFreeBlock(VmaBlockMetadata_TLSF *this,Block *block)

{
  byte bVar1;
  uint16_t uVar2;
  uint32_t uVar3;
  Block **ppBVar4;
  void **ppvVar5;
  Block *in_RSI;
  long in_RDI;
  uint32_t index;
  uint16_t secondIndex;
  uint8_t memClass;
  undefined7 in_stack_ffffffffffffffc8;
  uint8_t in_stack_ffffffffffffffcf;
  VkDeviceSize in_stack_ffffffffffffffd0;
  Block *pBVar6;
  VmaBlockMetadata_TLSF *in_stack_ffffffffffffffd8;
  
  ppBVar4 = Block::NextFree(in_RSI);
  if (*ppBVar4 != (Block *)0x0) {
    ppBVar4 = Block::PrevFree(in_RSI);
    in_stack_ffffffffffffffd8 = (VmaBlockMetadata_TLSF *)*ppBVar4;
    ppBVar4 = Block::NextFree(in_RSI);
    ppBVar4 = Block::PrevFree(*ppBVar4);
    *ppBVar4 = (Block *)in_stack_ffffffffffffffd8;
  }
  ppBVar4 = Block::PrevFree(in_RSI);
  if (*ppBVar4 == (Block *)0x0) {
    bVar1 = SizeToMemoryClass((VmaBlockMetadata_TLSF *)
                              CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),0x2f28c8
                             );
    uVar2 = SizeToSecondIndex(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                              in_stack_ffffffffffffffcf);
    uVar3 = GetListIndex(in_stack_ffffffffffffffd8,(uint8_t)(in_stack_ffffffffffffffd0 >> 0x38),
                         (uint16_t)(in_stack_ffffffffffffffd0 >> 0x20));
    ppBVar4 = Block::NextFree(in_RSI);
    *(Block **)(*(long *)(in_RDI + 0x138) + (ulong)uVar3 * 8) = *ppBVar4;
    ppBVar4 = Block::NextFree(in_RSI);
    if ((*ppBVar4 == (Block *)0x0) &&
       (*(uint *)(in_RDI + 0x48 + (ulong)bVar1 * 4) =
             (1 << ((byte)uVar2 & 0x1f) ^ 0xffffffffU) & *(uint *)(in_RDI + 0x48 + (ulong)bVar1 * 4)
       , *(int *)(in_RDI + 0x48 + (ulong)bVar1 * 4) == 0)) {
      *(uint *)(in_RDI + 0x40) =
           *(uint *)(in_RDI + 0x40) & ((uint)(1L << (bVar1 & 0x3f)) ^ 0xffffffff);
    }
  }
  else {
    ppBVar4 = Block::NextFree(in_RSI);
    pBVar6 = *ppBVar4;
    ppBVar4 = Block::PrevFree(in_RSI);
    ppBVar4 = Block::NextFree(*ppBVar4);
    *ppBVar4 = pBVar6;
  }
  Block::MarkTaken(in_RSI);
  ppvVar5 = Block::UserData(in_RSI);
  *ppvVar5 = (void *)0x0;
  *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + -1;
  *(VkDeviceSize *)(in_RDI + 0x38) = *(long *)(in_RDI + 0x38) - in_RSI->size;
  return;
}

Assistant:

void VmaBlockMetadata_TLSF::RemoveFreeBlock(Block* block)
{
    VMA_ASSERT(block != m_NullBlock);
    VMA_ASSERT(block->IsFree());

    if (block->NextFree() != VMA_NULL)
        block->NextFree()->PrevFree() = block->PrevFree();
    if (block->PrevFree() != VMA_NULL)
        block->PrevFree()->NextFree() = block->NextFree();
    else
    {
        uint8_t memClass = SizeToMemoryClass(block->size);
        uint16_t secondIndex = SizeToSecondIndex(block->size, memClass);
        uint32_t index = GetListIndex(memClass, secondIndex);
        VMA_ASSERT(m_FreeList[index] == block);
        m_FreeList[index] = block->NextFree();
        if (block->NextFree() == VMA_NULL)
        {
            m_InnerIsFreeBitmap[memClass] &= ~(1U << secondIndex);
            if (m_InnerIsFreeBitmap[memClass] == 0)
                m_IsFreeBitmap &= ~(1UL << memClass);
        }
    }
    block->MarkTaken();
    block->UserData() = VMA_NULL;
    --m_BlocksFreeCount;
    m_BlocksFreeSize -= block->size;
}